

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupRemapCis(Gia_Man_t *pNew,Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  Gia_Obj_t *pGVar2;
  int v;
  
  iVar1 = p->vCis->nSize;
  if (iVar1 != pNew->vCis->nSize) {
    __assert_fail("Vec_IntSize(p->vCis) == Vec_IntSize(pNew->vCis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x7f,"void Gia_ManDupRemapCis(Gia_Man_t *, Gia_Man_t *)");
  }
  v = 0;
  while( true ) {
    if (iVar1 <= v) {
      return;
    }
    pGVar2 = Gia_ManCi(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) {
      return;
    }
    iVar1 = Gia_ObjCioId(pGVar2);
    if (v != iVar1) {
      __assert_fail("Gia_ObjCioId(pObj) == i",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                    ,0x82,"void Gia_ManDupRemapCis(Gia_Man_t *, Gia_Man_t *)");
    }
    pGVar2 = Gia_ObjFromLit(pNew,pGVar2->Value);
    if (((ulong)pGVar2 & 1) != 0) break;
    p_00 = pNew->vCis;
    iVar1 = Gia_ObjId(pNew,pGVar2);
    Vec_IntWriteEntry(p_00,v,iVar1);
    Gia_ObjSetCioId(pGVar2,v);
    v = v + 1;
    iVar1 = p->vCis->nSize;
  }
  __assert_fail("!Gia_IsComplement(pObjNew)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                ,0x84,"void Gia_ManDupRemapCis(Gia_Man_t *, Gia_Man_t *)");
}

Assistant:

void Gia_ManDupRemapCis( Gia_Man_t * pNew, Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pObjNew;
    int i;
    assert( Vec_IntSize(p->vCis) == Vec_IntSize(pNew->vCis) );
    Gia_ManForEachCi( p, pObj, i )
    {
        assert( Gia_ObjCioId(pObj) == i );
        pObjNew = Gia_ObjFromLit( pNew, pObj->Value );
        assert( !Gia_IsComplement(pObjNew) );
        Vec_IntWriteEntry( pNew->vCis, i, Gia_ObjId(pNew, pObjNew) );
        Gia_ObjSetCioId( pObjNew, i );
    }
}